

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O0

int xmlC14NDocDumpMemory
              (xmlDocPtr doc,xmlNodeSetPtr nodes,int mode,xmlChar **inclusive_ns_prefixes,
              int with_comments,xmlChar **doc_txt_ptr)

{
  int iVar1;
  xmlOutputBufferPtr buf_00;
  size_t sVar2;
  xmlChar *pxVar3;
  xmlOutputBufferPtr buf;
  int ret;
  xmlChar **doc_txt_ptr_local;
  int with_comments_local;
  xmlChar **inclusive_ns_prefixes_local;
  int mode_local;
  xmlNodeSetPtr nodes_local;
  xmlDocPtr doc_local;
  
  if (doc_txt_ptr == (xmlChar **)0x0) {
    xmlC14NErrParam((xmlC14NCtxPtr)0x0);
    doc_local._4_4_ = -1;
  }
  else {
    *doc_txt_ptr = (xmlChar *)0x0;
    buf_00 = xmlAllocOutputBuffer((xmlCharEncodingHandlerPtr)0x0);
    if (buf_00 == (xmlOutputBufferPtr)0x0) {
      xmlC14NErrMemory((xmlC14NCtxPtr)0x0);
      doc_local._4_4_ = -1;
    }
    else {
      iVar1 = xmlC14NDocSaveTo(doc,nodes,mode,inclusive_ns_prefixes,with_comments,buf_00);
      if (iVar1 < 0) {
        xmlOutputBufferClose(buf_00);
        doc_local._4_4_ = -1;
      }
      else {
        sVar2 = xmlBufUse(buf_00->buffer);
        doc_local._4_4_ = (int)sVar2;
        if (-1 < doc_local._4_4_) {
          pxVar3 = xmlBufContent(buf_00->buffer);
          pxVar3 = xmlStrndup(pxVar3,doc_local._4_4_);
          *doc_txt_ptr = pxVar3;
        }
        xmlOutputBufferClose(buf_00);
        if ((*doc_txt_ptr == (xmlChar *)0x0) && (-1 < doc_local._4_4_)) {
          xmlC14NErrMemory((xmlC14NCtxPtr)0x0);
          doc_local._4_4_ = -1;
        }
      }
    }
  }
  return doc_local._4_4_;
}

Assistant:

int
xmlC14NDocDumpMemory(xmlDocPtr doc, xmlNodeSetPtr nodes,
                     int mode, xmlChar ** inclusive_ns_prefixes,
                     int with_comments, xmlChar ** doc_txt_ptr)
{
    int ret;
    xmlOutputBufferPtr buf;

    if (doc_txt_ptr == NULL) {
        xmlC14NErrParam(NULL);
        return (-1);
    }

    *doc_txt_ptr = NULL;

    /*
     * create memory buffer with UTF8 (default) encoding
     */
    buf = xmlAllocOutputBuffer(NULL);
    if (buf == NULL) {
        xmlC14NErrMemory(NULL);
        return (-1);
    }

    /*
     * canonize document and write to buffer
     */
    ret = xmlC14NDocSaveTo(doc, nodes, mode, inclusive_ns_prefixes,
                           with_comments, buf);
    if (ret < 0) {
        (void) xmlOutputBufferClose(buf);
        return (-1);
    }

    ret = xmlBufUse(buf->buffer);
    if (ret >= 0) {
        *doc_txt_ptr = xmlStrndup(xmlBufContent(buf->buffer), ret);
    }
    (void) xmlOutputBufferClose(buf);

    if ((*doc_txt_ptr == NULL) && (ret >= 0)) {
        xmlC14NErrMemory(NULL);
        return (-1);
    }
    return (ret);
}